

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)21>_> * __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::createDescriptorPool
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,BufferComputeInstance *this
          )

{
  VkDescriptorType type;
  deUint32 numDescriptors;
  DescriptorPoolBuilder *pDVar1;
  DescriptorPoolBuilder local_30;
  BufferComputeInstance *local_18;
  BufferComputeInstance *this_local;
  
  local_18 = this;
  this_local = (BufferComputeInstance *)__return_storage_ptr__;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_30);
  pDVar1 = ::vk::DescriptorPoolBuilder::addType(&local_30,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  type = this->m_descriptorType;
  numDescriptors = getInterfaceNumResources(this->m_shaderInterface);
  pDVar1 = ::vk::DescriptorPoolBuilder::addType(pDVar1,type,numDescriptors);
  ::vk::DescriptorPoolBuilder::build(__return_storage_ptr__,pDVar1,this->m_vki,this->m_device,1,1);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkDescriptorPool> BufferComputeInstance::createDescriptorPool (void) const
{
	return vk::DescriptorPoolBuilder()
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(m_descriptorType, getInterfaceNumResources(m_shaderInterface))
		.build(m_vki, m_device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1);
}